

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O2

void __thiscall
soul::heart::Printer::PrinterStream::printArgList
          (PrinterStream *this,ArrayView<soul::pool_ref<soul::heart::Expression>_> *args)

{
  pool_ref<soul::heart::Expression> *ppVar1;
  bool bVar2;
  pool_ref<soul::heart::Expression> *arg;
  pool_ref<soul::heart::Expression> *ppVar3;
  
  if (args->s != args->e) {
    choc::text::CodePrinter::operator<<(this->out," (");
    ppVar1 = args->e;
    bVar2 = true;
    for (ppVar3 = args->s; ppVar3 != ppVar1; ppVar3 = ppVar3 + 1) {
      if (!bVar2) {
        choc::text::CodePrinter::operator<<(this->out,", ");
      }
      printExpression(this,ppVar3->object);
      bVar2 = false;
    }
    choc::text::CodePrinter::operator<<(this->out,')');
    return;
  }
  choc::text::CodePrinter::operator<<(this->out,"()");
  return;
}

Assistant:

void printArgList (const ArrayView<pool_ref<heart::Expression>>& args)
        {
            if (args.empty())
            {
                out << "()";
                return;
            }

            out << " (";
            bool isFirst = true;

            for (auto& arg : args)
            {
                if (isFirst)
                    isFirst = false;
                else
                    out << ", ";

                printExpression (arg);
            }

            out << ')';
        }